

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O2

int io_file_readline(lua_State *L,FILE *fp,MSize chop)

{
  TValue *pTVar1;
  char *str;
  char *pcVar2;
  size_t sVar3;
  GCstr *pGVar4;
  ulong uVar5;
  size_t lenx;
  MSize sz;
  uint uVar6;
  uint local_40;
  
  sz = 0x2000;
  lenx = 0;
  local_40 = 0;
  do {
    str = lj_buf_tmp(L,sz);
    pcVar2 = fgets(str + lenx,sz - (int)lenx,(FILE *)fp);
    if (pcVar2 == (char *)0x0) {
LAB_00119ea4:
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      pGVar4 = lj_str_new(L,str,lenx);
      (pTVar1->u32).lo = (uint32_t)pGVar4;
      (pTVar1->field_2).it = 0xfffffffb;
      uVar5 = (ulong)(L->glref).ptr32;
      if (*(uint *)(uVar5 + 0x54) <= *(uint *)(uVar5 + 0x50)) {
        lj_gc_step(L);
      }
      return local_40;
    }
    sVar3 = strlen(str + lenx);
    uVar6 = (int)sVar3 + (int)lenx;
    lenx = (size_t)uVar6;
    local_40 = local_40 | uVar6;
    if ((uVar6 != 0) && (str[uVar6 - 1] == '\n')) {
      lenx = (size_t)(uVar6 - chop);
      goto LAB_00119ea4;
    }
    sz = sz << (sz - 0x40 <= uVar6);
  } while( true );
}

Assistant:

static int io_file_readline(lua_State *L, FILE *fp, MSize chop)
{
  MSize m = LUAL_BUFFERSIZE, n = 0, ok = 0;
  char *buf;
  for (;;) {
    buf = lj_buf_tmp(L, m);
    if (fgets(buf+n, m-n, fp) == NULL) break;
    n += (MSize)strlen(buf+n);
    ok |= n;
    if (n && buf[n-1] == '\n') { n -= chop; break; }
    if (n >= m - 64) m += m;
  }
  setstrV(L, L->top++, lj_str_new(L, buf, (size_t)n));
  lj_gc_check(L);
  return (int)ok;
}